

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O2

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_vending::vending_def::on,_unsigned_long>
::process_event<vending::events::start_maintenance>
          (state_transition_table<afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_vending::vending_def::on,_unsigned_long>
           *this,start_maintenance *event)

{
  event_process_result eVar1;
  
  eVar1 = actions::detail::
          inner_dispatch_table<std::tuple<afsm::state<vending::vending_def::on::out_of_service,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>
          ::process_event<vending::events::start_maintenance>
                    (&this->states_,this->current_state_,event);
  if (eVar1 == refuse) {
    eVar1 = process_transition_event<vending::events::start_maintenance>(this,event);
  }
  if (eVar1 == process) {
    check_default_transition(this);
  }
  return eVar1;
}

Assistant:

actions::event_process_result
    process_event(Event&& event)
    {
        // Try dispatch to inner states
        auto res = dispatch_table::process_event(states_, current_state(),
                ::std::forward<Event>(event));
        if (res == actions::event_process_result::refuse) {
            // Check if the event can cause a transition and process it
            res = process_transition_event(::std::forward<Event>(event));
        }
        if (res == actions::event_process_result::process) {
            check_default_transition();
        }
        return res;
    }